

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::VerifyMarkArenaMemoryBlockList(Recycler *this,ArenaMemoryBlock *memoryBlocks)

{
  ulong uVar1;
  ArenaMemoryBlock *blockp;
  ulong uVar2;
  
  if (memoryBlocks != (ArenaMemoryBlock *)0x0) {
    do {
      uVar1 = memoryBlocks->nbytes;
      if (7 < uVar1) {
        uVar2 = 0;
        do {
          VerifyMark(this,(void *)0x0,(&memoryBlocks[1].field_0)[uVar2].next);
          uVar2 = uVar2 + 1;
        } while (uVar1 >> 3 != uVar2);
      }
      memoryBlocks = (memoryBlocks->field_0).next;
    } while (memoryBlocks != (ArenaMemoryBlock *)0x0);
  }
  return;
}

Assistant:

void
Recycler::VerifyMarkArenaMemoryBlockList(ArenaMemoryBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    ArenaMemoryBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base=(void**)blockp->GetBytes();
        size_t slotCount = blockp->nbytes / sizeof(void*);
        scanRootBytes += blockp->nbytes;
        for (size_t i=0; i< slotCount; i++)
        {
            VerifyMark(base[i]);
        }
        blockp = blockp->next;
    }
}